

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastops_ut.cpp
# Opt level: O3

void UnitTestFunc<TAvxTanh<false,false>,TTanhCompare<false,false>,float>(void)

{
  char cVar1;
  undefined1 uVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  TTestExpOpts opts;
  undefined1 auVar5 [56];
  TTestExpOpts opts_00;
  TTestExpOpts opts_01;
  TTestExpOpts opts_02;
  TTestExpOpts opts_03;
  TTestExpOpts opts_04;
  TTestExpOpts opts_05;
  TTestExpOpts opts_06;
  TTestExpOpts opts_07;
  iterator iVar6;
  uint *puVar7;
  long lVar8;
  result_type rVar9;
  result_type rVar10;
  FastOpsTestException *this;
  ulong uVar11;
  size_t i_2;
  undefined1 uVar12;
  unsigned_long *puVar13;
  size_t i_3;
  size_t i;
  long lVar14;
  float out;
  float in;
  ostringstream out_1;
  mt19937_64 rng;
  undefined2 local_e2c;
  char local_e2a [2];
  float local_e28;
  float local_e24 [5];
  uint local_e10;
  uint local_e0c;
  uint local_e08;
  uint local_e04;
  uint local_e00;
  uint local_dfc;
  uint local_df8;
  uint local_df4;
  long local_df0;
  long local_de8;
  unsigned_long *local_de0;
  string local_dd8;
  undefined4 local_db8;
  undefined4 uStack_db4;
  undefined4 uStack_db0;
  undefined4 uStack_dac;
  undefined8 local_da8;
  long lStack_da0;
  undefined8 local_d98;
  long lStack_d90;
  long local_d88;
  undefined1 uStack_d80;
  undefined1 uStack_d7f;
  undefined6 uStack_d7e;
  undefined4 local_d78;
  undefined4 uStack_d74;
  undefined4 uStack_d70;
  undefined4 uStack_d6c;
  undefined8 local_d68;
  long lStack_d60;
  undefined8 local_d58;
  unsigned_long uStack_d50;
  unsigned_long local_d48;
  undefined1 uStack_d40;
  undefined1 uStack_d3f;
  undefined6 uStack_d3e;
  undefined4 local_d38;
  undefined4 uStack_d34;
  undefined4 uStack_d30;
  undefined4 uStack_d2c;
  undefined8 local_d28;
  long lStack_d20;
  undefined8 local_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined1 uStack_d00;
  undefined1 uStack_cff;
  undefined6 uStack_cfe;
  undefined4 local_cf8;
  undefined4 uStack_cf4;
  undefined4 uStack_cf0;
  undefined4 uStack_cec;
  undefined8 local_ce8;
  long lStack_ce0;
  undefined8 local_cd8;
  unsigned_long uStack_cd0;
  undefined8 local_cc8;
  undefined2 uStack_cc0;
  undefined6 uStack_cbe;
  undefined4 local_cb8;
  undefined4 uStack_cb4;
  undefined4 uStack_cb0;
  undefined4 uStack_cac;
  undefined8 local_ca8;
  long lStack_ca0;
  undefined8 local_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined1 uStack_c80;
  undefined1 uStack_c7f;
  undefined6 uStack_c7e;
  undefined4 local_c78;
  undefined4 uStack_c74;
  undefined4 uStack_c70;
  undefined4 uStack_c6c;
  undefined8 local_c68;
  undefined8 uStack_c60;
  undefined8 local_c58;
  undefined1 uStack_c50;
  undefined7 uStack_c4f;
  undefined1 uStack_c48;
  undefined7 uStack_c47;
  undefined1 uStack_c40;
  undefined1 uStack_c3f;
  undefined6 uStack_c3e;
  undefined4 local_c38;
  undefined4 uStack_c34;
  undefined4 uStack_c30;
  undefined4 uStack_c2c;
  undefined8 local_c28;
  undefined8 uStack_c20;
  undefined8 local_c18;
  undefined1 uStack_c10;
  undefined7 uStack_c0f;
  undefined1 uStack_c08;
  undefined7 uStack_c07;
  undefined1 uStack_c00;
  undefined1 uStack_bff;
  undefined6 uStack_bfe;
  undefined4 local_bf8;
  undefined4 uStack_bf4;
  undefined4 uStack_bf0;
  undefined4 uStack_bec;
  undefined8 local_be8;
  undefined8 uStack_be0;
  undefined8 local_bd8;
  undefined1 uStack_bd0;
  undefined7 uStack_bcf;
  undefined1 uStack_bc8;
  undefined7 uStack_bc7;
  undefined1 uStack_bc0;
  undefined1 uStack_bbf;
  undefined6 uStack_bbe;
  undefined4 local_bb8;
  undefined4 uStack_bb4;
  undefined4 uStack_bb0;
  undefined4 uStack_bac;
  undefined8 local_ba8;
  long lStack_ba0;
  undefined8 local_b98;
  undefined1 uStack_b90;
  undefined7 uStack_b8f;
  undefined1 uStack_b88;
  undefined7 uStack_b87;
  undefined1 uStack_b80;
  undefined1 uStack_b7f;
  undefined6 uStack_b7e;
  unsigned_long *local_b78;
  iterator iStack_b70;
  unsigned_long *local_b68;
  mt19937_64 local_9f8;
  
  local_e2a[0] = '\0';
  local_e2a[1] = '\x01';
  local_df0 = 0;
  do {
    cVar1 = local_e2a[local_df0];
    local_e2c = 0x100;
    lVar14 = 0;
    do {
      uVar2 = *(undefined1 *)((long)&local_e2c + lVar14);
      if (cVar1 == '\0') {
        local_e04 = MXCSR;
        local_e08 = MXCSR | 0x8000;
        local_e0c = MXCSR | 0x8000;
        local_e10 = MXCSR | 0x8040;
        puVar7 = &local_e10;
      }
      else {
        local_df4 = MXCSR;
        local_df8 = MXCSR & 0xffff7fff;
        local_dfc = MXCSR & 0xffff7fff;
        local_e00 = MXCSR & 0xffff7fbf;
        puVar7 = &local_e00;
      }
      MXCSR = *puVar7;
      local_9f8._M_x[0] = 0xf;
      lVar8 = 1;
      uVar11 = 0xf;
      do {
        uVar11 = (uVar11 >> 0x3e ^ uVar11) * 0x5851f42d4c957f2d + lVar8;
        local_9f8._M_x[lVar8] = uVar11;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x138);
      local_9f8._M_p = 0x138;
      local_e24[0] = 2.0;
      local_e28 = 2.0;
      NFastOps::TanhAvx<false,false>(local_e24,0,&local_e28);
      if ((((local_e24[0] != 2.0) || (NAN(local_e24[0]))) || (local_e28 != 2.0)) || (NAN(local_e28))
         ) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_b78);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_b78,"assertion failed ",0x11);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_b78,"in == 2 && out == 2",0x13);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_b78," at ",4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_b78,"UnitTestFunc",0xc)
        ;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_b78,", ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_b78,
                   "/workspace/llm4binary/github/license_c_cmakelists/yandex[P]fastops/fastops/ut/fastops_ut.cpp"
                   ,0x5c);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_b78,":",1);
        std::ostream::operator<<((ostream *)&local_b78,0x11c);
        this = (FastOpsTestException *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        FastOpsTestException::FastOpsTestException(this,&local_dd8);
        __cxa_throw(this,&FastOpsTestException::typeinfo,FastOpsTestException::~FastOpsTestException
                   );
      }
      NFastOps::TanhAvx<false,false>((float *)0x0,0,(float *)0x0);
      lVar8 = 1;
      local_de8 = lVar14;
      do {
        uStack_d10 = 0;
        uStack_d08 = 0;
        local_d38 = 3;
        uStack_d34 = 0xc0400000;
        uStack_d30 = 0x40400000;
        local_d28 = 2000;
        local_d18 = 0x32;
        uStack_d00 = 1;
        opts.Inplace = (bool)uVar2;
        opts.IsRandom = true;
        opts._58_6_ = uStack_cfe;
        auVar5 = ZEXT4056(CONCAT832(0x32,CONCAT824(lVar8,CONCAT816(2000,CONCAT88(CONCAT44(uStack_d2c
                                                                                          ,
                                                  0x40400000),0xc040000000000003)))));
        opts.Func = auVar5._0_4_;
        opts.Min = (float)auVar5._4_4_;
        opts.Max = (float)auVar5._8_4_;
        opts._12_4_ = auVar5._12_4_;
        opts.N = auVar5._16_8_;
        opts.VecSize = auVar5._24_8_;
        opts.PadSize = auVar5._32_8_;
        opts.InputAlignBytes = auVar5._40_8_;
        opts.OutputAlignBytes = auVar5._48_8_;
        lStack_d20 = lVar8;
        uStack_cff = uVar2;
        TestFunc<TAvxTanh<false,false>,TTanhCompare<false,false>,float>(&local_9f8,opts);
        lVar8 = lVar8 + 1;
      } while (lVar8 != 500);
      lVar14 = 1;
      do {
        uStack_c90 = 0;
        uStack_c88 = 0;
        uStack_c80 = 0;
        local_cb8 = 3;
        uStack_cb4 = 0xc1a00000;
        uStack_cb0 = 0x41a00000;
        local_ca8 = 2000;
        local_c98 = 0x32;
        lVar8 = (ulong)CONCAT61(uStack_c7e,uVar2) << 8;
        auVar5 = ZEXT4056(CONCAT832(0x32,CONCAT824(lVar14,CONCAT816(2000,CONCAT88(CONCAT44(
                                                  uStack_cac,0x41a00000),0xc1a0000000000003)))));
        opts_00.IsRandom = (bool)(char)lVar8;
        opts_00.Inplace = (bool)(char)((ulong)lVar8 >> 8);
        opts_00._58_6_ = (int6)((ulong)lVar8 >> 0x10);
        opts_00.Func = auVar5._0_4_;
        opts_00.Min = (float)auVar5._4_4_;
        opts_00.Max = (float)auVar5._8_4_;
        opts_00._12_4_ = auVar5._12_4_;
        opts_00.N = auVar5._16_8_;
        opts_00.VecSize = auVar5._24_8_;
        opts_00.PadSize = auVar5._32_8_;
        opts_00.InputAlignBytes = auVar5._40_8_;
        opts_00.OutputAlignBytes = auVar5._48_8_;
        lStack_ca0 = lVar14;
        uStack_c7f = uVar2;
        TestFunc<TAvxTanh<false,false>,TTanhCompare<false,false>,float>(&local_9f8,opts_00);
        lVar14 = lVar14 + 1;
      } while (lVar14 != 500);
      local_b78 = (unsigned_long *)0x0;
      iStack_b70._M_current = (unsigned_long *)0x0;
      local_b68 = (unsigned_long *)0x0;
      local_dd8._M_dataplus._M_p = (pointer)0x1;
      do {
        if (iStack_b70._M_current == local_b68) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_b78,iStack_b70,
                     (unsigned_long *)&local_dd8);
        }
        else {
          *iStack_b70._M_current = (unsigned_long)local_dd8._M_dataplus._M_p;
          iStack_b70._M_current = iStack_b70._M_current + 1;
        }
        iVar6._M_current = iStack_b70._M_current;
        local_dd8._M_dataplus._M_p = local_dd8._M_dataplus._M_p + 1;
      } while (local_dd8._M_dataplus._M_p < (pointer)0x20);
      puVar13 = local_b78;
      if (local_b78 == iStack_b70._M_current) {
LAB_0012e83e:
        uVar12 = 0;
      }
      else {
        do {
          uVar3 = *puVar13;
          lVar14 = 1;
          do {
            local_cf8 = 3;
            uStack_cf4 = 0xc1a00000;
            uStack_cf0 = 0x41a00000;
            local_ce8 = 1000;
            local_cd8 = 0x32;
            local_cc8 = 0;
            uStack_cc0 = 1;
            opts_01._12_4_ = uStack_cec;
            opts_01.Max = 20.0;
            opts_01._58_6_ = uStack_cbe;
            opts_01.IsRandom = true;
            opts_01.Inplace = false;
            opts_01.Func = Tanh;
            opts_01.Min = -20.0;
            opts_01.N = 1000;
            opts_01.VecSize = lVar14;
            opts_01.PadSize = 0x32;
            opts_01.InputAlignBytes = uVar3;
            opts_01.OutputAlignBytes = 0;
            lStack_ce0 = lVar14;
            uStack_cd0 = uVar3;
            TestFunc<TAvxTanh<false,false>,TTanhCompare<false,false>,float>(&local_9f8,opts_01);
            lVar14 = lVar14 + 1;
          } while (lVar14 != 200);
          puVar13 = puVar13 + 1;
        } while (puVar13 != iVar6._M_current);
        local_de0 = iStack_b70._M_current;
        puVar13 = local_b78;
        if (local_b78 == iStack_b70._M_current) goto LAB_0012e83e;
        do {
          uVar4 = *puVar13;
          lVar14 = 1;
          do {
            local_d78 = 3;
            uStack_d74 = 0xc1a00000;
            uStack_d70 = 0x41a00000;
            local_d68 = 1000;
            local_d58 = 0x32;
            uStack_d40 = 1;
            opts_02._12_4_ = uStack_d6c;
            opts_02.Max = 20.0;
            opts_02.Inplace = (bool)uVar2;
            opts_02.IsRandom = true;
            opts_02._58_6_ = uStack_d3e;
            opts_02.Func = Tanh;
            opts_02.Min = -20.0;
            opts_02.N = 1000;
            opts_02.VecSize = lVar14;
            opts_02.PadSize = 0x32;
            opts_02.InputAlignBytes = uVar3;
            opts_02.OutputAlignBytes = uVar4;
            lStack_d60 = lVar14;
            uStack_d50 = uVar3;
            local_d48 = uVar4;
            uStack_d3f = uVar2;
            TestFunc<TAvxTanh<false,false>,TTanhCompare<false,false>,float>(&local_9f8,opts_02);
            lVar14 = lVar14 + 1;
          } while (lVar14 != 200);
          puVar13 = puVar13 + 1;
          uVar12 = uVar2;
        } while (puVar13 != local_de0);
      }
      lVar14 = 0;
      do {
        lVar8 = 1;
        do {
          rVar9 = std::
                  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                  ::operator()(&local_9f8);
          rVar10 = std::
                   mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                   ::operator()(&local_9f8);
          lStack_d90 = rVar9 % 0x1f + 1;
          local_d88 = rVar10 % 0x1f + 1;
          local_db8 = 3;
          uStack_db4 = 0xc1a00000;
          uStack_db0 = 0x41a00000;
          local_da8 = 1000;
          local_d98 = 0x32;
          uStack_d80 = 1;
          opts_03._12_4_ = uStack_dac;
          opts_03.Max = 20.0;
          opts_03.Inplace = (bool)uVar12;
          opts_03.IsRandom = true;
          opts_03._58_6_ = uStack_d7e;
          opts_03.Func = Tanh;
          opts_03.Min = -20.0;
          opts_03.N = 1000;
          opts_03.VecSize = lVar8;
          opts_03.PadSize = 0x32;
          opts_03.InputAlignBytes = lStack_d90;
          opts_03.OutputAlignBytes = local_d88;
          lStack_da0 = lVar8;
          uStack_d7f = uVar12;
          TestFunc<TAvxTanh<false,false>,TTanhCompare<false,false>,float>(&local_9f8,opts_03);
          lVar8 = lVar8 + 1;
        } while (lVar8 != 100);
        lVar14 = lVar14 + 1;
      } while (lVar14 != 0x1e);
      if (local_b78 != (unsigned_long *)0x0) {
        operator_delete(local_b78,(long)local_b68 - (long)local_b78);
      }
      lVar14 = 1;
      do {
        uStack_b88 = 0;
        uStack_b87 = 0;
        uStack_b80 = 0;
        local_b98 = 0;
        uStack_b90 = 0;
        uStack_b8f = 0;
        local_bb8 = 3;
        uStack_bb4 = 0xc1a00000;
        uStack_bb0 = 0x41a00000;
        local_ba8 = 10000;
        lVar8 = (ulong)CONCAT61(uStack_b7e,uVar2) << 8;
        auVar5 = ZEXT3256(CONCAT824(lVar14,CONCAT816(10000,CONCAT88(CONCAT44(uStack_bac,0x41a00000),
                                                                    0xc1a0000000000003))));
        opts_04.IsRandom = (bool)(char)lVar8;
        opts_04.Inplace = (bool)(char)((ulong)lVar8 >> 8);
        opts_04._58_6_ = (int6)((ulong)lVar8 >> 0x10);
        opts_04.Func = auVar5._0_4_;
        opts_04.Min = (float)auVar5._4_4_;
        opts_04.Max = (float)auVar5._8_4_;
        opts_04._12_4_ = auVar5._12_4_;
        opts_04.N = auVar5._16_8_;
        opts_04.VecSize = auVar5._24_8_;
        opts_04.PadSize = auVar5._32_8_;
        opts_04.InputAlignBytes = auVar5._40_8_;
        opts_04.OutputAlignBytes = auVar5._48_8_;
        lStack_ba0 = lVar14;
        uStack_b7f = uVar2;
        TestFunc<TAvxTanh<false,false>,TTanhCompare<false,false>,float>(&local_9f8,opts_04);
        lVar14 = lVar14 + 1;
      } while (lVar14 != 200);
      local_bf8 = 3;
      uStack_bf4 = 0xc1a00000;
      uStack_bf0 = 0x41a00000;
      local_be8 = 5000000;
      uStack_be0 = 0x10;
      uStack_bc8 = 0;
      uStack_bc7 = 0;
      uStack_bc0 = 0;
      local_bd8 = 0;
      uStack_bd0 = 0;
      uStack_bcf = 0;
      lVar14 = (ulong)CONCAT61(uStack_bbe,uVar2) << 8;
      auVar5 = ZEXT3256(CONCAT824(0x10,CONCAT816(5000000,CONCAT88(CONCAT44(uStack_bec,0x41a00000),
                                                                  0xc1a0000000000003))));
      opts_05.IsRandom = (bool)(char)lVar14;
      opts_05.Inplace = (bool)(char)((ulong)lVar14 >> 8);
      opts_05._58_6_ = (int6)((ulong)lVar14 >> 0x10);
      opts_05.Func = auVar5._0_4_;
      opts_05.Min = (float)auVar5._4_4_;
      opts_05.Max = (float)auVar5._8_4_;
      opts_05._12_4_ = auVar5._12_4_;
      opts_05.N = auVar5._16_8_;
      opts_05.VecSize = auVar5._24_8_;
      opts_05.PadSize = auVar5._32_8_;
      opts_05.InputAlignBytes = auVar5._40_8_;
      opts_05.OutputAlignBytes = auVar5._48_8_;
      uStack_bbf = uVar2;
      TestFunc<TAvxTanh<false,false>,TTanhCompare<false,false>,float>(&local_9f8,opts_05);
      local_c38 = 3;
      uStack_c34 = 0xc0a00000;
      uStack_c30 = 0x40a00000;
      local_c28 = 5000000;
      uStack_c20 = 0x10;
      uStack_c08 = 0;
      uStack_c07 = 0;
      uStack_c00 = 0;
      local_c18 = 0;
      uStack_c10 = 0;
      uStack_c0f = 0;
      lVar14 = (ulong)CONCAT61(uStack_bfe,uVar2) << 8;
      auVar5 = ZEXT3256(CONCAT824(0x10,CONCAT816(5000000,CONCAT88(CONCAT44(uStack_c2c,0x40a00000),
                                                                  0xc0a0000000000003))));
      opts_06.IsRandom = (bool)(char)lVar14;
      opts_06.Inplace = (bool)(char)((ulong)lVar14 >> 8);
      opts_06._58_6_ = (int6)((ulong)lVar14 >> 0x10);
      opts_06.Func = auVar5._0_4_;
      opts_06.Min = (float)auVar5._4_4_;
      opts_06.Max = (float)auVar5._8_4_;
      opts_06._12_4_ = auVar5._12_4_;
      opts_06.N = auVar5._16_8_;
      opts_06.VecSize = auVar5._24_8_;
      opts_06.PadSize = auVar5._32_8_;
      opts_06.InputAlignBytes = auVar5._40_8_;
      opts_06.OutputAlignBytes = auVar5._48_8_;
      uStack_bff = uVar2;
      TestFunc<TAvxTanh<false,false>,TTanhCompare<false,false>,float>(&local_9f8,opts_06);
      local_c78 = 3;
      uStack_c74 = 0xb6a7c5ac;
      uStack_c70 = 0x36a7c5ac;
      local_c68 = 500000;
      uStack_c60 = 0x10;
      uStack_c48 = 0;
      uStack_c47 = 0;
      uStack_c40 = 0;
      local_c58 = 0;
      uStack_c50 = 0;
      uStack_c4f = 0;
      lVar14 = (ulong)CONCAT61(uStack_c3e,uVar2) << 8;
      auVar5 = ZEXT3256(CONCAT824(0x10,CONCAT816(500000,CONCAT88(CONCAT44(uStack_c6c,0x36a7c5ac),
                                                                 0xb6a7c5ac00000003))));
      opts_07.IsRandom = (bool)(char)lVar14;
      opts_07.Inplace = (bool)(char)((ulong)lVar14 >> 8);
      opts_07._58_6_ = (int6)((ulong)lVar14 >> 0x10);
      opts_07.Func = auVar5._0_4_;
      opts_07.Min = (float)auVar5._4_4_;
      opts_07.Max = (float)auVar5._8_4_;
      opts_07._12_4_ = auVar5._12_4_;
      opts_07.N = auVar5._16_8_;
      opts_07.VecSize = auVar5._24_8_;
      opts_07.PadSize = auVar5._32_8_;
      opts_07.InputAlignBytes = auVar5._40_8_;
      opts_07.OutputAlignBytes = auVar5._48_8_;
      uStack_c3f = uVar2;
      TestFunc<TAvxTanh<false,false>,TTanhCompare<false,false>,float>(&local_9f8,opts_07);
      lVar14 = local_de8 + 1;
    } while (lVar14 != 2);
    local_df0 = local_df0 + 1;
    if (local_df0 == 2) {
      return;
    }
  } while( true );
}

Assistant:

void UnitTestFunc() {
    try {
        float min = -150;
        float max = 150;
        if (sizeof(T) != 4) {
            min = -1000;
            max = 1000;
        }

        if (TFunc::GetType() == EFunc::Sigmoid || TFunc::GetType() == EFunc::Tanh) {
            min = -20;
            max = 20;
        }

        for (bool enableDenormals : {false, true}) {
            for (bool inplace : {false, true}) {
                if (enableDenormals) {
                    _MM_SET_FLUSH_ZERO_MODE(_MM_FLUSH_ZERO_OFF);
                    _MM_SET_DENORMALS_ZERO_MODE(_MM_DENORMALS_ZERO_OFF);
                } else {
                    _MM_SET_FLUSH_ZERO_MODE(_MM_FLUSH_ZERO_ON);
                    _MM_SET_DENORMALS_ZERO_MODE(_MM_DENORMALS_ZERO_ON);
                }

                std::mt19937_64 rng(15);
                // there should be no error on zero-size input
                {
                    T in = 2;
                    T out = 2;
                    TFunc::Apply(&in, 0, &out);
                    UNIT_ASSERT(in == 2 && out == 2);

                    TFunc::Apply((float*)nullptr, 0, (float*)nullptr);
                }

                // random test (near numbers must be vastly different)
                for (size_t i = 1; i < 500; ++i) {
                    TTestExpOpts opts;
                    opts.Func = TFunc::GetType();

                    // othewise we will almost always get 1
                    if (TFunc::GetType() == EFunc::Sigmoid || TFunc::GetType() == EFunc::Tanh) {
                        opts.Min = -3;
                        opts.Max = 3;
                    }

                    opts.N = 2000;
                    opts.VecSize = i;
                    opts.PadSize = 50;
                    opts.IsRandom = true;
                    opts.Inplace = inplace;
                    TestFunc<TFunc, TCompare, T>(rng, opts);
                }

                // roughly test precision + if there is no memory issues
                for (size_t i = 1; i < 500; ++i) {
                    TTestExpOpts opts;
                    opts.Func = TFunc::GetType();
                    opts.Min = min;
                    opts.Max = max;
                    opts.N = 2000;
                    opts.VecSize = i;
                    opts.PadSize = 50;
                    opts.Inplace = inplace;
                    TestFunc<TFunc, TCompare, T>(rng, opts);
                }

                // roughly test precision + that there is no memory issues in an unaligned case
                if (!TFunc::Aligned) {
                    std::vector<size_t> alignments;
                    for (size_t i = 1; i < 32; ++i) {
                        alignments.push_back(i);
                    }
                    TTestExpOpts opts;
                    opts.Func = TFunc::GetType();
                    opts.Min = min;
                    opts.Max = max;
                    opts.N = 1000;
                    opts.IsRandom = true;
                    opts.PadSize = 50;
                    for (size_t alignment : alignments) {
                        for (size_t i = 1; i < 200; ++i) {
                            opts.VecSize = i;
                            opts.OutputAlignBytes = 0;
                            opts.InputAlignBytes = alignment;
                            TestFunc<TFunc, TCompare, T>(rng, opts);
                        }
                    }
                    if (!TFunc::Aligned) {
                        for (size_t alignment : alignments) {
                            for (size_t i = 1; i < 200; ++i) {
                                opts.VecSize = i;
                                opts.OutputAlignBytes = alignment;
                                opts.Inplace = inplace;
                                TestFunc<TFunc, TCompare, T>(rng, opts);
                            }
                        }
                        for (size_t iterIdx = 0; iterIdx < 30; ++iterIdx) {
                            (void)(iterIdx);
                            for (size_t i = 1; i < 100; ++i) {
                                opts.VecSize = i;
                                opts.InputAlignBytes = rng() % 31 + 1;
                                opts.OutputAlignBytes = rng() % 31 + 1;
                                TestFunc<TFunc, TCompare, T>(rng, opts);
                            }
                        }
                    }
                }

                // Test precision in more detail
                for (size_t i = 1; i < 200; ++i) {
                    TTestExpOpts opts;
                    opts.Func = TFunc::GetType();
                    opts.Min = min;
                    opts.Max = max;
                    opts.N = 10000;
                    opts.VecSize = i;
                    opts.Inplace = inplace;
                    TestFunc<TFunc, TCompare, T>(rng, opts);
                }

                // Test precision in even more detail
                TTestExpOpts opts;
                opts.Func = TFunc::GetType();
                opts.Min = min;
                opts.Max = max;
                opts.N = 5000000;
                opts.VecSize = 16;
                opts.Inplace = inplace;
                TestFunc<TFunc, TCompare, T>(rng, opts);

                opts.Min = -5;
                opts.Max = 5;
                opts.Inplace = inplace;
                TestFunc<TFunc, TCompare, T>(rng, opts);

                // analyze behavior near zero
                opts.Min = -0.000005;
                opts.Max = 0.000005;
                opts.N = 500000;
                opts.Inplace = inplace;
                TestFunc<TFunc, TCompare, T>(rng, opts);
            }
        }
    } catch (...) {
        _MM_SET_FLUSH_ZERO_MODE(_MM_FLUSH_ZERO_OFF);
        _MM_SET_DENORMALS_ZERO_MODE(_MM_DENORMALS_ZERO_OFF);
        throw;
    }
}